

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QJsonArray,_std::less<QString>,_std::allocator<std::pair<const_QString,_QJsonArray>_>_>_>_>
::~QExplicitlySharedDataPointerV2
          (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QJsonArray,_std::less<QString>,_std::allocator<std::pair<const_QString,_QJsonArray>_>_>_>_>
           *this)

{
  QMapData<std::map<QString,_QJsonArray,_std::less<QString>,_std::allocator<std::pair<const_QString,_QJsonArray>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QMapData<std::map<QString,_QJsonArray,_std::less<QString>,_std::allocator<std::pair<const_QString,_QJsonArray>_>_>_>
                 *)0x0) {
    LOCK();
    *(int *)pQVar1 = *(int *)pQVar1 + -1;
    UNLOCK();
    if (*(int *)pQVar1 == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QMapData<std::map<QString,_QJsonArray,_std::less<QString>,_std::allocator<std::pair<const_QString,_QJsonArray>_>_>_>
                     *)0x0) {
        std::
        _Rb_tree<QString,_std::pair<const_QString,_QJsonArray>,_std::_Select1st<std::pair<const_QString,_QJsonArray>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QJsonArray>_>_>
        ::_M_erase((_Rb_tree<QString,_std::pair<const_QString,_QJsonArray>,_std::_Select1st<std::pair<const_QString,_QJsonArray>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QJsonArray>_>_>
                    *)(pQVar1 + 8),*(_Link_type *)(pQVar1 + 0x18));
      }
      operator_delete(pQVar1,0x38);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }